

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O0

vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
* __thiscall imrt::ApertureILS::getOrderedApertureNeighbors(ApertureILS *this,Plan *P)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  size_type sVar5;
  reference ppSVar6;
  Plan *in_RDX;
  long *in_RSI;
  vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  *in_RDI;
  pair<std::pair<int,_int>,_std::pair<int,_int>_> pVar7;
  pair<std::pair<int,_int>,_std::pair<int,_int>_> pVar8;
  int i;
  int k_1;
  int a_1;
  int k;
  int a;
  int s;
  pair<int,_int> active;
  pair<int,_int> pattern;
  int beamlet;
  iterator st;
  vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  a_list;
  int s_target;
  Station *target_station;
  pair<bool,_std::pair<imrt::Station_*,_int>_> target_beam;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> stations;
  vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  *final_list;
  Collimator *in_stack_fffffffffffffba8;
  pair<int,_int> in_stack_fffffffffffffbb0;
  pair<int,_int> __x;
  pair<int,_int> in_stack_fffffffffffffbb8;
  pair<int,_int> in_stack_fffffffffffffbc0;
  pair<int,_int> in_stack_fffffffffffffbc8;
  pair<int,_int> in_stack_fffffffffffffbd0;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *in_stack_fffffffffffffbe8;
  undefined4 in_stack_fffffffffffffbf0;
  undefined4 in_stack_fffffffffffffbf4;
  int local_24c;
  pair<int,_int> local_198;
  pair<int,_int> local_190;
  int local_188;
  int local_184;
  pair<std::pair<int,_int>,_std::pair<int,_int>_> *local_180;
  pair<std::pair<int,_int>,_std::pair<int,_int>_> *local_178;
  undefined4 local_16c;
  pair<int,_int> local_168;
  pair<int,_int> local_160;
  pair<std::pair<int,_int>,_std::pair<int,_int>_> local_158;
  undefined4 local_148;
  pair<int,_int> local_144;
  pair<int,_int> local_13c;
  pair<std::pair<int,_int>,_std::pair<int,_int>_> local_134;
  pair<int,_int> local_124;
  undefined4 local_11c;
  pair<int,_int> local_118;
  pair<int,_int> local_110;
  pair<std::pair<int,_int>,_std::pair<int,_int>_> local_108;
  undefined4 local_f8;
  pair<int,_int> local_f4;
  pair<int,_int> local_ec;
  pair<std::pair<int,_int>,_std::pair<int,_int>_> local_e4;
  pair<int,_int> local_d4;
  pair<int,_int> local_cc;
  pair<int,_int> local_c4;
  int local_bc;
  int local_b8;
  int local_b4;
  pair<int,_int> local_b0;
  pair<int,_int> local_a8;
  _List_node_base *local_a0;
  int local_94;
  _List_iterator<imrt::Station_*> local_90;
  undefined1 local_81;
  vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  local_80;
  int local_64;
  Station *local_60;
  undefined1 local_48 [8];
  Station *local_40;
  Plan *local_18;
  
  local_18 = in_RDX;
  Plan::get_stations_abi_cxx11_(in_RDX);
  std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::list
            ((list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)
             CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),in_stack_fffffffffffffbe8
            );
  (**(code **)(*in_RSI + 0x38))(local_48,in_RSI,local_18);
  local_60 = local_40;
  std::
  vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  ::vector((vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
            *)0x16e05f);
  local_81 = 0;
  std::
  vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  ::vector((vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
            *)0x16e074);
  std::_List_iterator<imrt::Station_*>::_List_iterator(&local_90);
  local_a0 = (_List_node_base *)
             std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::begin
                       ((list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)
                        in_stack_fffffffffffffba8);
  local_90._M_node = local_a0;
  std::pair<int,_int>::pair<int,_int,_true>(&local_a8);
  std::pair<int,_int>::pair<int,_int,_true>(&local_b0);
  local_b4 = 0;
  while( true ) {
    uVar4 = (ulong)local_b4;
    sVar5 = std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::size
                      ((list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)
                       in_stack_fffffffffffffbb0);
    if (sVar5 <= uVar4) break;
    ppSVar6 = std::_List_iterator<imrt::Station_*>::operator*
                        ((_List_iterator<imrt::Station_*> *)0x16e10d);
    iVar2 = Station::getAngle(*ppSVar6);
    iVar3 = Station::getAngle(local_60);
    if (iVar2 == iVar3) {
      local_64 = local_b4;
    }
    else {
      local_b8 = 0;
      while( true ) {
        iVar2 = local_b8;
        ppSVar6 = std::_List_iterator<imrt::Station_*>::operator*
                            ((_List_iterator<imrt::Station_*> *)0x16e1cb);
        iVar3 = Station::getNbApertures(*ppSVar6);
        if (iVar3 <= iVar2) break;
        local_bc = 0;
        while( true ) {
          iVar2 = local_bc;
          ppSVar6 = std::_List_iterator<imrt::Station_*>::operator*
                              ((_List_iterator<imrt::Station_*> *)0x16e218);
          iVar3 = Collimator::getXdim((*ppSVar6)->collimator);
          if (iVar3 <= iVar2) break;
          std::_List_iterator<imrt::Station_*>::operator*
                    ((_List_iterator<imrt::Station_*> *)0x16e253);
          local_c4 = Station::getApertureShape((Station *)in_stack_fffffffffffffba8,0,0x16e269);
          std::pair<int,_int>::operator=(&local_a8,&local_c4);
          std::_List_iterator<imrt::Station_*>::operator*
                    ((_List_iterator<imrt::Station_*> *)0x16e2ad);
          ppSVar6 = std::_List_iterator<imrt::Station_*>::operator*
                              ((_List_iterator<imrt::Station_*> *)0x16e2da);
          Station::getAngle(*ppSVar6);
          local_cc = Collimator::getActiveRange(in_stack_fffffffffffffba8,0,0x16e306);
          std::pair<int,_int>::operator=(&local_b0,&local_cc);
          if (local_b0.first != -1) {
            std::_List_iterator<imrt::Station_*>::operator*
                      ((_List_iterator<imrt::Station_*> *)0x16e351);
            local_d4 = std::make_pair<int&,int&>((int *)in_stack_fffffffffffffba8,(int *)0x16e371);
            local_94 = Station::getBeamIndex
                                 ((Station *)in_stack_fffffffffffffba8,in_stack_fffffffffffffbb0);
            std::_List_iterator<imrt::Station_*>::operator*
                      ((_List_iterator<imrt::Station_*> *)0x16e3c4);
            bVar1 = Station::isOpenBeamlet
                              ((Station *)in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0.second
                               ,in_stack_fffffffffffffbb0.first);
            if (bVar1) {
              local_ec = std::make_pair<int&,int&>((int *)in_stack_fffffffffffffba8,(int *)0x16e408)
              ;
              local_f8 = 0xffffffff;
              local_f4 = std::make_pair<int,int&>((int *)in_stack_fffffffffffffba8,(int *)0x16e442);
              pVar7 = std::make_pair<std::pair<int,int>,std::pair<int,int>>
                                ((pair<int,_int> *)in_stack_fffffffffffffbb0,
                                 (pair<int,_int> *)in_stack_fffffffffffffba8);
              local_e4 = pVar7;
              std::
              vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
              ::push_back((vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                           *)in_stack_fffffffffffffbb0,(value_type *)in_stack_fffffffffffffba8);
            }
            else {
              local_110 = std::make_pair<int&,int&>
                                    ((int *)in_stack_fffffffffffffba8,(int *)0x16e4d4);
              local_11c = 1;
              local_118 = std::make_pair<int,int&>((int *)in_stack_fffffffffffffba8,(int *)0x16e50e)
              ;
              pVar7 = std::make_pair<std::pair<int,int>,std::pair<int,int>>
                                ((pair<int,_int> *)in_stack_fffffffffffffbb0,
                                 (pair<int,_int> *)in_stack_fffffffffffffba8);
              local_108 = pVar7;
              std::
              vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
              ::push_back((vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                           *)in_stack_fffffffffffffbb0,(value_type *)in_stack_fffffffffffffba8);
            }
            if (local_a8.first != local_a8.second) {
              std::_List_iterator<imrt::Station_*>::operator*
                        ((_List_iterator<imrt::Station_*> *)0x16e5a9);
              local_124 = std::make_pair<int&,int&>
                                    ((int *)in_stack_fffffffffffffba8,(int *)0x16e5c9);
              local_94 = Station::getBeamIndex
                                   ((Station *)in_stack_fffffffffffffba8,in_stack_fffffffffffffbb0);
              std::_List_iterator<imrt::Station_*>::operator*
                        ((_List_iterator<imrt::Station_*> *)0x16e61c);
              bVar1 = Station::isOpenBeamlet
                                ((Station *)in_stack_fffffffffffffbb8,
                                 in_stack_fffffffffffffbb0.second,in_stack_fffffffffffffbb0.first);
              if (bVar1) {
                local_13c = std::make_pair<int&,int&>
                                      ((int *)in_stack_fffffffffffffba8,(int *)0x16e660);
                local_148 = 0xfffffffe;
                local_144 = std::make_pair<int,int&>
                                      ((int *)in_stack_fffffffffffffba8,(int *)0x16e69a);
                pVar7 = std::make_pair<std::pair<int,int>,std::pair<int,int>>
                                  ((pair<int,_int> *)in_stack_fffffffffffffbb0,
                                   (pair<int,_int> *)in_stack_fffffffffffffba8);
                local_134 = pVar7;
                std::
                vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                ::push_back((vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                             *)in_stack_fffffffffffffbb0,(value_type *)in_stack_fffffffffffffba8);
              }
              else {
                local_160 = std::make_pair<int&,int&>
                                      ((int *)in_stack_fffffffffffffba8,(int *)0x16e72c);
                local_16c = 1;
                local_168 = std::make_pair<int,int&>
                                      ((int *)in_stack_fffffffffffffba8,(int *)0x16e766);
                pVar7 = std::make_pair<std::pair<int,int>,std::pair<int,int>>
                                  ((pair<int,_int> *)in_stack_fffffffffffffbb0,
                                   (pair<int,_int> *)in_stack_fffffffffffffba8);
                local_158 = pVar7;
                std::
                vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                ::push_back((vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                             *)in_stack_fffffffffffffbb0,(value_type *)in_stack_fffffffffffffba8);
              }
            }
          }
          local_bc = local_bc + 1;
        }
        local_b8 = local_b8 + 1;
      }
      std::advance<std::_List_iterator<imrt::Station*>,int>
                ((_List_iterator<imrt::Station_*> *)in_stack_fffffffffffffbd0,
                 in_stack_fffffffffffffbc8.second);
    }
    local_b4 = local_b4 + 1;
  }
  local_178 = (pair<std::pair<int,_int>,_std::pair<int,_int>_> *)
              std::
              vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
              ::begin((vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                       *)in_stack_fffffffffffffba8);
  local_180 = (pair<std::pair<int,_int>,_std::pair<int,_int>_> *)
              std::
              vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
              ::end((vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                     *)in_stack_fffffffffffffba8);
  std::
  random_shuffle<__gnu_cxx::__normal_iterator<std::pair<std::pair<int,int>,std::pair<int,int>>*,std::vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>>>
            ((__normal_iterator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_*,_std::vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
              )in_stack_fffffffffffffbd0,
             (__normal_iterator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_*,_std::vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
              )in_stack_fffffffffffffbc8);
  pVar7.second = in_stack_fffffffffffffbb0;
  pVar7.first = in_stack_fffffffffffffbb8;
  local_184 = 0;
  while( true ) {
    iVar2 = local_184;
    iVar3 = Station::getNbApertures(local_60);
    if (iVar3 <= iVar2) break;
    local_188 = 0;
    while( true ) {
      iVar2 = local_188;
      iVar3 = Collimator::getXdim(local_60->collimator);
      if (iVar3 <= iVar2) break;
      Station::getAngle(local_60);
      local_190 = Collimator::getActiveRange(in_stack_fffffffffffffba8,0,0x16e966);
      std::pair<int,_int>::operator=(&local_b0,&local_190);
      if (local_b0.first != -1) {
        local_198 = Station::getApertureShape((Station *)in_stack_fffffffffffffba8,0,0x16e9bf);
        std::pair<int,_int>::operator=(&local_a8,&local_198);
        std::make_pair<int&,int&>((int *)in_stack_fffffffffffffba8,(int *)0x16ea1b);
        local_94 = Station::getBeamIndex((Station *)in_stack_fffffffffffffba8,pVar7.second);
        bVar1 = Station::isOpenBeamlet
                          ((Station *)pVar7.first,pVar7.second.second,pVar7.second.first);
        if (bVar1) {
          std::make_pair<int&,int&>((int *)in_stack_fffffffffffffba8,(int *)0x16eaaa);
          std::make_pair<int,int&>((int *)in_stack_fffffffffffffba8,(int *)0x16eae4);
          std::make_pair<std::pair<int,int>,std::pair<int,int>>
                    ((pair<int,_int> *)pVar7.second,(pair<int,_int> *)in_stack_fffffffffffffba8);
          std::
          vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
          ::push_back((vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                       *)pVar7.second,(value_type *)in_stack_fffffffffffffba8);
        }
        else {
          std::make_pair<int&,int&>((int *)in_stack_fffffffffffffba8,(int *)0x16eb76);
          std::make_pair<int,int&>((int *)in_stack_fffffffffffffba8,(int *)0x16ebaa);
          std::make_pair<std::pair<int,int>,std::pair<int,int>>
                    ((pair<int,_int> *)pVar7.second,(pair<int,_int> *)in_stack_fffffffffffffba8);
          std::
          vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
          ::push_back((vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                       *)pVar7.second,(value_type *)in_stack_fffffffffffffba8);
        }
        if (local_a8.first != local_a8.second) {
          std::make_pair<int&,int&>((int *)in_stack_fffffffffffffba8,(int *)0x16ec48);
          local_94 = Station::getBeamIndex((Station *)in_stack_fffffffffffffba8,pVar7.second);
          bVar1 = Station::isOpenBeamlet
                            ((Station *)pVar7.first,pVar7.second.second,pVar7.second.first);
          __x = pVar7.second;
          if (bVar1) {
            std::make_pair<int&,int&>((int *)in_stack_fffffffffffffba8,(int *)0x16ecc2);
            std::make_pair<int,int&>((int *)in_stack_fffffffffffffba8,(int *)0x16ecf6);
            pVar8 = std::make_pair<std::pair<int,int>,std::pair<int,int>>
                              ((pair<int,_int> *)pVar7.second,
                               (pair<int,_int> *)in_stack_fffffffffffffba8);
            in_stack_fffffffffffffbd0 = pVar8.second;
            std::
            vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
            ::push_back((vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                         *)pVar7.second,(value_type *)in_stack_fffffffffffffba8);
          }
          else {
            in_stack_fffffffffffffbc8 =
                 std::make_pair<int&,int&>((int *)in_stack_fffffffffffffba8,(int *)0x16ed76);
            in_stack_fffffffffffffbc0 =
                 std::make_pair<int,int&>((int *)in_stack_fffffffffffffba8,(int *)0x16edaa);
            pVar7 = std::make_pair<std::pair<int,int>,std::pair<int,int>>
                              ((pair<int,_int> *)__x,(pair<int,_int> *)in_stack_fffffffffffffba8);
            std::
            vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
            ::push_back((vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                         *)pVar7.second,(value_type *)in_stack_fffffffffffffba8);
          }
        }
      }
      local_188 = local_188 + 1;
    }
    local_184 = local_184 + 1;
  }
  std::
  vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  ::begin((vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
           *)in_stack_fffffffffffffba8);
  std::
  vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  ::end((vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
         *)in_stack_fffffffffffffba8);
  std::
  random_shuffle<__gnu_cxx::__normal_iterator<std::pair<std::pair<int,int>,std::pair<int,int>>*,std::vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>>>
            ((__normal_iterator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_*,_std::vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
              )in_stack_fffffffffffffbd0,
             (__normal_iterator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_*,_std::vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>_>
              )in_stack_fffffffffffffbc8);
  local_24c = 0;
  while( true ) {
    uVar4 = (ulong)local_24c;
    sVar5 = std::
            vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
            ::size(&local_80);
    if (sVar5 <= uVar4) break;
    std::
    vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
    ::operator[](&local_80,(long)local_24c);
    std::
    vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
    ::push_back((vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                 *)in_stack_fffffffffffffbc0,(value_type *)pVar7.first);
    local_24c = local_24c + 1;
  }
  local_81 = 1;
  std::
  vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  ::~vector((vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
             *)in_stack_fffffffffffffbc0);
  std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::~list
            ((list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)0x16ef2a);
  return in_RDI;
}

Assistant:

vector < pair<pair<int, int>, pair<int, int>> > ApertureILS::getOrderedApertureNeighbors(Plan &P){
  list<Station*> stations = P.get_stations();
  
  pair<bool, pair<Station*, int>> target_beam = getBestLSBeamlet(P);
  Station * target_station = target_beam.second.first;
  int s_target;
  
  vector<pair< pair<int,int> , pair<int, int> >> a_list, final_list;
  list<Station*>::iterator st;
  int beamlet;
  st = stations.begin();
  
  pair <int,int> pattern;
  pair <int,int> active;
  
  for (int s = 0; s < stations.size(); s++) {
    if ((*st)->getAngle() == target_station->getAngle()){
      s_target=s;
      continue;
    }
    for (int a = 0; a < (*st)->getNbApertures(); a++){
      for (int k = 0; k< (*st)->collimator.getXdim() ; k++){
        //One pair -k (-row) for closing aperture
        //One pair (k) (row) for opening aperture
        pattern = (*st)->getApertureShape(a, k);
        active = (*st)->collimator.getActiveRange(k, (*st)->getAngle());
        if (active.first == -1) continue;
        beamlet = (*st)->getBeamIndex(make_pair(k,pattern.first));
        if((*st)->isOpenBeamlet(beamlet, a))
          a_list.push_back(make_pair(make_pair(s,a) , make_pair(-1,beamlet)));
        else 
          a_list.push_back(make_pair(make_pair(s,a) , make_pair( 1,beamlet)));
        
        if (pattern.first != pattern.second) {
          beamlet = (*st)->getBeamIndex(make_pair(k,pattern.second));
          if((*st)->isOpenBeamlet(beamlet, a))
            a_list.push_back(make_pair(make_pair(s,a) , make_pair(-2,beamlet)));
          else 
            a_list.push_back(make_pair(make_pair(s,a) , make_pair( 1,beamlet)));
        }
      }
    }
    std::advance(st,1);
  }
  std::random_shuffle(a_list.begin(), a_list.end());
  
  // Add target station neighbors
  for (int a = 0; a < target_station->getNbApertures(); a++) {
    for (int k = 0; k< target_station->collimator.getXdim() ; k++) {
      active = target_station->collimator.getActiveRange(k, target_station->getAngle());
      if (active.first == -1) continue;
      pattern = target_station->getApertureShape(a, k);
      
      beamlet = target_station->getBeamIndex(make_pair(k,pattern.first));
      if (target_station->isOpenBeamlet(beamlet, a))
        final_list.push_back (make_pair(make_pair(s_target,a) , make_pair(-1,beamlet)));
      else 
        final_list.push_back (make_pair(make_pair(s_target,a) , make_pair( 1,beamlet)));
      
      if (pattern.first != pattern.second) {
        beamlet = target_station->getBeamIndex(make_pair(k,pattern.second));
        if (target_station->isOpenBeamlet(beamlet, a))
          final_list.push_back (make_pair(make_pair(s_target,a) , make_pair(-2,beamlet)));
        else 
          final_list.push_back(make_pair(make_pair(s_target,a) , make_pair( 1,beamlet)));
      }
    }
  }
  std::random_shuffle(final_list.begin(), final_list.end());
  for (int i=0; i<a_list.size(); i++) {
    final_list.push_back(a_list[i]);
  }
  
  return(final_list);
}